

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsLayoutPrivate::getMargin
          (QGraphicsLayoutPrivate *this,qreal *result,qreal userMargin,PixelMetric pm)

{
  bool bVar1;
  int iVar2;
  QGraphicsLayoutItem *this_00;
  QGraphicsItem *this_01;
  QStyle *pQVar3;
  
  if (result != (qreal *)0x0) {
    this_00 = QGraphicsLayoutItem::parentLayoutItem((this->super_QGraphicsLayoutItemPrivate).q_ptr);
    if ((userMargin < 0.0) && (userMargin = 0.0, this_00 != (QGraphicsLayoutItem *)0x0)) {
      bVar1 = QGraphicsLayoutItem::isLayout(this_00);
      *result = 0.0;
      if (bVar1) {
        return;
      }
      this_01 = QGraphicsLayoutItemPrivate::parentItem(&this->super_QGraphicsLayoutItemPrivate);
      if (this_01 == (QGraphicsItem *)0x0) {
        return;
      }
      bVar1 = QGraphicsItem::isWidget(this_01);
      if (!bVar1) {
        return;
      }
      pQVar3 = QGraphicsWidget::style((QGraphicsWidget *)(this_01 + -1));
      iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,pm,0,0);
      userMargin = (qreal)iVar2;
    }
    *result = userMargin;
  }
  return;
}

Assistant:

void QGraphicsLayoutPrivate::getMargin(qreal *result, qreal userMargin, QStyle::PixelMetric pm) const
{
    if (!result)
        return;
    Q_Q(const QGraphicsLayout);

    QGraphicsLayoutItem *parent = q->parentLayoutItem();
    if (userMargin >= 0.0) {
        *result = userMargin;
    } else if (!parent) {
        *result = 0.0;
    } else if (parent->isLayout()) {    // sublayouts have 0 margin by default
        *result = 0.0;
    } else {
        *result = 0.0;
        if (QGraphicsItem *layoutParentItem = parentItem()) {
            if (layoutParentItem->isWidget())
                *result = (qreal)static_cast<QGraphicsWidget*>(layoutParentItem)->style()->pixelMetric(pm, nullptr);
        }
    }
}